

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplaceRealloc<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pointer pos,
          pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
          *args)

{
  ulong uVar1;
  Symbol *pSVar2;
  ConfigBlockSymbol *pCVar3;
  HierarchicalInstanceSyntax *pHVar4;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  *__cur_1;
  undefined8 *puVar5;
  pointer ppVar6;
  undefined8 *puVar7;
  pointer ppVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    pEVar9 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar10 = (long)pos - *(long *)this;
  puVar5 = (undefined8 *)operator_new((long)pEVar9 << 5);
  pSVar2 = (args->first).definition;
  pCVar3 = (args->first).configRoot;
  pHVar4 = args->second;
  puVar7 = (undefined8 *)((long)puVar5 + lVar10 + 0x10);
  *puVar7 = (args->first).configRule;
  puVar7[1] = pHVar4;
  *(undefined8 *)((long)puVar5 + lVar10) = pSVar2;
  ((undefined8 *)((long)puVar5 + lVar10))[1] = pCVar3;
  ppVar8 = *(pointer *)this;
  ppVar6 = ppVar8 + *(long *)(this + 8);
  puVar7 = puVar5;
  if (ppVar6 == pos) {
    for (; ppVar8 != pos; ppVar8 = ppVar8 + 1) {
      pSVar2 = (ppVar8->first).definition;
      pCVar3 = (ppVar8->first).configRoot;
      pHVar4 = ppVar8->second;
      puVar7[2] = (ppVar8->first).configRule;
      puVar7[3] = pHVar4;
      *puVar7 = pSVar2;
      puVar7[1] = pCVar3;
      puVar7 = puVar7 + 4;
    }
  }
  else {
    for (; ppVar8 != pos; ppVar8 = ppVar8 + 1) {
      pSVar2 = (ppVar8->first).definition;
      pCVar3 = (ppVar8->first).configRoot;
      pHVar4 = ppVar8->second;
      puVar7[2] = (ppVar8->first).configRule;
      puVar7[3] = pHVar4;
      *puVar7 = pSVar2;
      puVar7[1] = pCVar3;
      puVar7 = puVar7 + 4;
    }
    puVar7 = (undefined8 *)(lVar10 + (long)puVar5);
    for (; pos != ppVar6; pos = pos + 1) {
      pSVar2 = (pos->first).definition;
      pCVar3 = (pos->first).configRoot;
      pHVar4 = pos->second;
      puVar7[6] = (pos->first).configRule;
      puVar7[7] = pHVar4;
      puVar7[4] = pSVar2;
      puVar7[5] = pCVar3;
      puVar7 = puVar7 + 4;
    }
  }
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  ::cleanup((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar9;
  *(undefined8 **)this = puVar5;
  return (pointer)((long)puVar5 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}